

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compareB44.cpp
# Opt level: O0

bool withinB44ErrorBounds(half (*A) [4],half (*B) [4])

{
  ushort uVar1;
  short sVar2;
  uint16_t uVar3;
  int iVar4;
  byte bVar5;
  long in_RSI;
  long in_RDI;
  float fVar6;
  float fVar7;
  unsigned_short Bbits;
  unsigned_short A1bits;
  int i_5;
  int bias;
  unsigned_short A1 [16];
  int i_4;
  int bias_1;
  int i_3;
  int rMax;
  int rMin;
  int r [15];
  int d [16];
  int shift;
  int i_2;
  unsigned_short tMax;
  unsigned_short Abits;
  int i_1;
  unsigned_short t [16];
  int j;
  int i;
  bool equal;
  undefined7 in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed7;
  ushort local_124;
  int local_120;
  ushort local_118 [4];
  short local_110;
  short local_10e;
  short local_10c;
  short local_10a;
  short local_108;
  short local_106;
  short local_104;
  short local_102;
  short local_100;
  short local_fe;
  short local_fc;
  short local_fa;
  int local_ec;
  undefined4 local_e8;
  int local_e4;
  int local_e0;
  int local_dc;
  int local_d8 [16];
  int local_98 [4];
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  ushort local_50;
  uint16_t local_4e;
  int local_4c;
  ushort local_48 [18];
  int local_24;
  int local_20;
  byte local_19;
  long local_18;
  long local_10;
  
  local_19 = 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  for (local_20 = 0; local_20 < 4; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 4; local_24 = local_24 + 1) {
      fVar6 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      fVar7 = Imath_3_2::half::operator_cast_to_float
                        ((half *)CONCAT17(in_stack_fffffffffffffed7,in_stack_fffffffffffffed0));
      if ((fVar6 != fVar7) || (NAN(fVar6) || NAN(fVar7))) {
        local_19 = 0;
      }
    }
  }
  if ((local_19 & 1) == 0) {
    for (local_4c = 0; local_4c < 0x10; local_4c = local_4c + 1) {
      local_4e = Imath_3_2::half::bits
                           ((half *)(local_10 + (long)(local_4c / 4) * 8 + (long)(local_4c % 4) * 2)
                           );
      if ((local_4e & 0x7c00) == 0x7c00) {
        local_48[local_4c] = 0x8000;
      }
      else if ((local_4e & 0x8000) == 0) {
        local_48[local_4c] = local_4e | 0x8000;
      }
      else {
        local_48[local_4c] = local_4e ^ 0xffff;
      }
    }
    local_50 = 0;
    for (local_54 = 0; local_54 < 0x10; local_54 = local_54 + 1) {
      if (local_50 < local_48[local_54]) {
        local_50 = local_48[local_54];
      }
    }
    local_58 = -1;
    do {
      local_58 = local_58 + 1;
      for (local_e4 = 0; local_e4 < 0x10; local_e4 = local_e4 + 1) {
        iVar4 = shiftAndRound((uint)local_50 - (uint)local_48[local_e4],local_58);
        local_98[local_e4] = iVar4;
      }
      local_e8 = 0x20;
      local_d8[0] = (local_98[0] - local_88) + 0x20;
      local_d8[1] = (local_88 - local_78) + 0x20;
      local_d8[2] = (local_78 - local_68) + 0x20;
      local_d8[3] = (local_98[0] - local_98[1]) + 0x20;
      local_d8[4] = (local_88 - local_84) + 0x20;
      local_d8[5] = (local_78 - local_74) + 0x20;
      local_d8[6] = (local_68 - local_64) + 0x20;
      local_d8[7] = (local_98[1] - local_98[2]) + 0x20;
      local_d8[8] = (local_84 - local_80) + 0x20;
      local_d8[9] = (local_74 - local_70) + 0x20;
      local_d8[10] = (local_64 - local_60) + 0x20;
      local_d8[0xb] = (local_98[2] - local_98[3]) + 0x20;
      local_d8[0xc] = (local_80 - local_7c) + 0x20;
      local_d8[0xd] = (local_70 - local_6c) + 0x20;
      local_d8[0xe] = (local_60 - local_5c) + 0x20;
      local_dc = local_d8[0];
      local_e0 = local_d8[0];
      for (local_ec = 1; local_ec < 0xf; local_ec = local_ec + 1) {
        if (local_d8[local_ec] < local_dc) {
          local_dc = local_d8[local_ec];
        }
        if (local_e0 < local_d8[local_ec]) {
          local_e0 = local_d8[local_ec];
        }
      }
    } while (local_dc < 0 || 0x3f < local_e0);
    bVar5 = (byte)local_58;
    local_48[0] = local_50 - (short)(local_98[0] << (bVar5 & 0x1f));
    local_118[0] = local_48[0];
    sVar2 = (short)(0x20 << (bVar5 & 0x1f));
    local_110 = (local_48[0] + (short)(local_d8[0] << (bVar5 & 0x1f))) - sVar2;
    local_108 = (local_110 + (short)(local_d8[1] << (bVar5 & 0x1f))) - sVar2;
    local_100 = (local_108 + (short)(local_d8[2] << (bVar5 & 0x1f))) - sVar2;
    local_118[1] = (local_48[0] + (short)(local_d8[3] << (bVar5 & 0x1f))) - sVar2;
    local_10e = (local_110 + (short)(local_d8[4] << (bVar5 & 0x1f))) - sVar2;
    local_106 = (local_108 + (short)(local_d8[5] << (bVar5 & 0x1f))) - sVar2;
    local_fe = (local_100 + (short)(local_d8[6] << (bVar5 & 0x1f))) - sVar2;
    local_118[2] = (local_118[1] + (short)(local_d8[7] << (bVar5 & 0x1f))) - sVar2;
    local_10c = (local_10e + (short)(local_d8[8] << (bVar5 & 0x1f))) - sVar2;
    local_104 = (local_106 + (short)(local_d8[9] << (bVar5 & 0x1f))) - sVar2;
    local_fc = (local_fe + (short)(local_d8[10] << (bVar5 & 0x1f))) - sVar2;
    local_118[3] = (local_118[2] + (short)(local_d8[0xb] << (bVar5 & 0x1f))) - sVar2;
    local_10a = (local_10c + (short)(local_d8[0xc] << (bVar5 & 0x1f))) - sVar2;
    local_102 = (local_104 + (short)(local_d8[0xd] << (bVar5 & 0x1f))) - sVar2;
    local_fa = (local_fc + (short)(local_d8[0xe] << (bVar5 & 0x1f))) - sVar2;
    for (local_120 = 0; local_120 < 0x10; local_120 = local_120 + 1) {
      uVar1 = local_118[local_120];
      uVar3 = Imath_3_2::half::bits
                        ((half *)(local_18 + (long)(local_120 / 4) * 8 + (long)(local_120 % 4) * 2))
      ;
      if ((uVar3 & 0x8000) == 0) {
        local_124 = uVar3 | 0x8000;
      }
      else {
        local_124 = uVar3 ^ 0xffff;
      }
      if ((uVar1 + 5 < (uint)local_124) || ((int)(uint)local_124 < (int)(uVar1 - 5))) {
        return false;
      }
    }
  }
  return true;
}

Assistant:

bool
withinB44ErrorBounds (const half A[4][4], const half B[4][4])
{
    //
    // Assuming that a 4x4 pixel block, B, was generated by
    // compressing and uncompressing another pixel block, A,
    // using OpenEXR's B44 compression method, check whether
    // the differences between A and B are what we would
    // expect from the compressor.
    //

    //
    // The block may not have been compressed at all if it
    // was part of a very small tile.
    //

    bool equal = true;

    for (int i = 0; i < 4; ++i)
        for (int j = 0; j < 4; ++j)
            if (A[i][j] != B[i][j]) equal = false;

    if (equal) return true;

    //
    // The block was compressed.
    //
    // Perform a "light" version of the B44 compression on A
    // (see the pack() function in ImfB44Compressor.cpp).
    //

    unsigned short t[16];

    for (int i = 0; i < 16; ++i)
    {
        unsigned short Abits = A[i / 4][i % 4].bits ();

        if ((Abits & 0x7c00) == 0x7c00)
            t[i] = 0x8000;
        else if (Abits & 0x8000)
            t[i] = ~Abits;
        else
            t[i] = Abits | 0x8000;
    }

    unsigned short tMax = 0;

    for (int i = 0; i < 16; ++i)
        if (tMax < t[i]) tMax = t[i];

    int shift = -1;
    int d[16];
    int r[15];
    int rMin;
    int rMax;

    do
    {
        shift += 1;

        for (int i = 0; i < 16; ++i)
            d[i] = shiftAndRound (tMax - t[i], shift);

        const int bias = 0x20;

        r[0] = d[0] - d[4] + bias;
        r[1] = d[4] - d[8] + bias;
        r[2] = d[8] - d[12] + bias;

        r[3] = d[0] - d[1] + bias;
        r[4] = d[4] - d[5] + bias;
        r[5] = d[8] - d[9] + bias;
        r[6] = d[12] - d[13] + bias;

        r[7]  = d[1] - d[2] + bias;
        r[8]  = d[5] - d[6] + bias;
        r[9]  = d[9] - d[10] + bias;
        r[10] = d[13] - d[14] + bias;

        r[11] = d[2] - d[3] + bias;
        r[12] = d[6] - d[7] + bias;
        r[13] = d[10] - d[11] + bias;
        r[14] = d[14] - d[15] + bias;

        rMin = r[0];
        rMax = r[0];

        for (int i = 1; i < 15; ++i)
        {
            if (rMin > r[i]) rMin = r[i];

            if (rMax < r[i]) rMax = r[i];
        }
    } while (rMin < 0 || rMax > 0x3f);

    t[0] = tMax - (d[0] << shift);

    //
    // Now perform a "light" version of the decompression method.
    // (see the unpack() function in ImfB44Compressor.cpp).
    //

    unsigned short A1[16];
    const int      bias = 0x20 << shift;

    A1[0]  = t[0];
    A1[4]  = A1[0] + (r[0] << shift) - bias;
    A1[8]  = A1[4] + (r[1] << shift) - bias;
    A1[12] = A1[8] + (r[2] << shift) - bias;

    A1[1]  = A1[0] + (r[3] << shift) - bias;
    A1[5]  = A1[4] + (r[4] << shift) - bias;
    A1[9]  = A1[8] + (r[5] << shift) - bias;
    A1[13] = A1[12] + (r[6] << shift) - bias;

    A1[2]  = A1[1] + (r[7] << shift) - bias;
    A1[6]  = A1[5] + (r[8] << shift) - bias;
    A1[10] = A1[9] + (r[9] << shift) - bias;
    A1[14] = A1[13] + (r[10] << shift) - bias;

    A1[3]  = A1[2] + (r[11] << shift) - bias;
    A1[7]  = A1[6] + (r[12] << shift) - bias;
    A1[11] = A1[10] + (r[13] << shift) - bias;
    A1[15] = A1[14] + (r[14] << shift) - bias;

    //
    // Compare the result with B, allowing for an difference
    // of a couple of units in the last place.
    //

    for (int i = 0; i < 16; ++i)
    {
        unsigned short A1bits = A1[i];
        unsigned short Bbits  = B[i / 4][i % 4].bits ();

        if (Bbits & 0x8000)
            Bbits = ~Bbits;
        else
            Bbits = Bbits | 0x8000;

        if (Bbits > A1bits + 5 || Bbits < A1bits - 5) return false;
    }

    return true;
}